

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcMaj3.c
# Opt level: O0

int Zyx_TestReadNode(char *pLine,Vec_Wrd_t *vTruths,int nVars,int nLutSize,int iObj)

{
  long lVar1;
  int iVar2;
  word *pIn1;
  size_t sVar3;
  word *pwVar4;
  byte bVar5;
  int local_c4;
  word *pLast;
  word *pThis;
  char *pFanins;
  char *pTruth;
  word *pFaninsW [6];
  int nWords;
  int j;
  int k;
  int iObj_local;
  int nLutSize_local;
  int nVars_local;
  Vec_Wrd_t *vTruths_local;
  char *pLine_local;
  
  pFaninsW[5]._0_4_ = Abc_TtWordNum(nVars);
  iVar2 = Vec_WrdSize(vTruths);
  pIn1 = Zyx_TestTruth(vTruths,iVar2 / (int)pFaninsW[5] + -1,(int)pFaninsW[5]);
  sVar3 = strlen(pLine);
  if (pLine[sVar3 - 1] == '\n') {
    sVar3 = strlen(pLine);
    pLine[sVar3 - 1] = '\0';
  }
  sVar3 = strlen(pLine);
  if (pLine[sVar3 - 1] == '\r') {
    sVar3 = strlen(pLine);
    pLine[sVar3 - 1] = '\0';
  }
  if (*pLine == '\0') {
    pLine_local._4_4_ = 0;
  }
  else {
    sVar3 = strlen(pLine);
    bVar5 = (byte)nLutSize;
    if ((int)sVar3 == nLutSize + 1 + (1 << (bVar5 & 0x1f))) {
      if ((int)*pLine == iObj + 0x41) {
        lVar1 = (long)(1 << (bVar5 & 0x1f)) + 1;
        for (nWords = nLutSize + -1; -1 < nWords; nWords = nWords + -1) {
          if (pLine[nWords + lVar1] < 'a') {
            local_c4 = pLine[nWords + lVar1] + -0x41;
          }
          else {
            local_c4 = pLine[nWords + lVar1] + -0x61;
          }
          pwVar4 = Zyx_TestTruth(vTruths,local_c4,(int)pFaninsW[5]);
          pFaninsW[(long)nWords + -1] = pwVar4;
        }
        pwVar4 = Zyx_TestTruth(vTruths,iObj,(int)pFaninsW[5]);
        Abc_TtConst0(pwVar4,(int)pFaninsW[5]);
        for (nWords = 0; nWords < 1 << (bVar5 & 0x1f); nWords = nWords + 1) {
          if (pLine[(long)(((1 << (bVar5 & 0x1f)) + -1) - nWords) + 1] != '0') {
            Abc_TtConst1(pIn1,(int)pFaninsW[5]);
            for (pFaninsW[5]._4_4_ = 0; pFaninsW[5]._4_4_ < nLutSize;
                pFaninsW[5]._4_4_ = pFaninsW[5]._4_4_ + 1) {
              Abc_TtAndCompl(pIn1,pIn1,0,pFaninsW[(long)pFaninsW[5]._4_4_ + -1],
                             (uint)(((nWords >> ((byte)pFaninsW[5]._4_4_ & 0x1f) & 1U) != 0 ^ 0xffU)
                                   & 1),(int)pFaninsW[5]);
            }
            Abc_TtOr(pwVar4,pwVar4,pIn1,(int)pFaninsW[5]);
          }
        }
        pLine_local._4_4_ = 1;
      }
      else {
        printf("The output node in line %s is not correct.\n",pLine);
        pLine_local._4_4_ = 0;
      }
    }
    else {
      sVar3 = strlen(pLine);
      printf("Node representation has %d chars (expecting %d chars).\n",sVar3 & 0xffffffff,
             (ulong)(uint)(nLutSize + 1 + (1 << (bVar5 & 0x1f))));
      pLine_local._4_4_ = 0;
    }
  }
  return pLine_local._4_4_;
}

Assistant:

int Zyx_TestReadNode( char * pLine, Vec_Wrd_t * vTruths, int nVars, int nLutSize, int iObj )
{
    int k, j, nWords = Abc_TtWordNum(nVars);
    word * pFaninsW[6]; char * pTruth, * pFanins;
    word * pThis, * pLast = Zyx_TestTruth( vTruths, Vec_WrdSize(vTruths)/nWords - 1, nWords );
    if ( pLine[strlen(pLine)-1] == '\n' ) pLine[strlen(pLine)-1] = 0;
    if ( pLine[strlen(pLine)-1] == '\r' ) pLine[strlen(pLine)-1] = 0;
    if ( pLine[0] == 0 )
        return 0;
    if ( (int)strlen(pLine) != 1 + nLutSize + (1 << nLutSize) )
    {
        printf( "Node representation has %d chars (expecting %d chars).\n", (int)strlen(pLine), 1 + nLutSize + (1 << nLutSize) );
        return 0;
    }
    if ( pLine[0] != 'A' + iObj )
    {
        printf( "The output node in line %s is not correct.\n", pLine );
        return 0;
    }
    pTruth  = pLine + 1;
    pFanins = pTruth + (1 << nLutSize);
    for ( k = nLutSize - 1; k >= 0; k-- )
        pFaninsW[k] = Zyx_TestTruth( vTruths, pFanins[k] >= 'a' ? pFanins[k] - 'a' : pFanins[k] - 'A', nWords );
    pThis = Zyx_TestTruth(vTruths, iObj, nWords);
    Abc_TtConst0( pThis, nWords );
    for ( k = 0; k < (1 << nLutSize); k++ )
    {
        if ( pTruth[(1 << nLutSize) - 1 - k] == '0' )
            continue;
        Abc_TtConst1( pLast, nWords );
        for ( j = 0; j < nLutSize; j++ )
            Abc_TtAndCompl( pLast, pLast, 0, pFaninsW[j], !((k >> j) & 1), nWords );
        Abc_TtOr( pThis, pThis, pLast, nWords );
    }
    //Dau_DsdPrintFromTruth( pThis, nVars );
    return 1;
}